

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsEndpointSendMessage(HelicsEndpoint endpoint,HelicsMessage message,HelicsError *err)

{
  EndpointObject *pEVar1;
  Message *pMVar2;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Message *mess;
  EndpointObject *endObj;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsMessage in_stack_ffffffffffffffd8;
  
  pEVar1 = anon_unknown.dwarf_784a3::verifyEndpoint
                     (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if ((pEVar1 != (EndpointObject *)0x0) &&
     (pMVar2 = getMessageObj(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0),
     pMVar2 != (Message *)0x0)) {
    helics::Endpoint::send(pEVar1->endPtr,(int)pMVar2,__buf,in_RCX,in_R8D);
  }
  return;
}

Assistant:

void helicsEndpointSendMessage(HelicsEndpoint endpoint, HelicsMessage message, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        endObj->endPtr->send(*mess);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}